

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

void Kernel::InferenceStore::Smt2ProofCheckPrinter::outputFunctionName(ostream *out,uint f)

{
  InnerType *l;
  bool bVar1;
  Interpretation itp;
  ostream *poVar2;
  string *name;
  UserErrorException *this;
  char *pcVar3;
  RationalConstantType local_70;
  IntegerConstantType i;
  RealConstantType r;
  
  bVar1 = Theory::isInterpretedFunction((Theory *)theory,f);
  if (bVar1) {
    itp = Theory::interpretFunction((Theory *)theory,f);
    outputInterpretationName(out,itp);
    return;
  }
  bVar1 = Theory::isInterpretedConstant((Theory *)theory,f);
  if (bVar1) {
    mpz_init(i._val);
    RationalConstantType::RationalConstantType(&r.super_RationalConstantType);
    bVar1 = Theory::tryInterpretConstant((Theory *)theory,f,&i);
    if (bVar1) {
      IntegerConstantType::IntegerConstantType(&local_70._num,0);
      bVar1 = Kernel::operator<(&i,&local_70._num);
      IntegerConstantType::~IntegerConstantType(&local_70._num);
      if (bVar1) {
        poVar2 = std::operator<<(out,"(- ");
        IntegerConstantType::abs(&local_70._num,(int)&i);
        poVar2 = Kernel::operator<<(poVar2,&local_70._num);
        std::operator<<(poVar2,")");
        IntegerConstantType::~IntegerConstantType(&local_70._num);
      }
      else {
        Kernel::operator<<(out,&i);
      }
    }
    else {
      bVar1 = Theory::tryInterpretConstant((Theory *)theory,f,&r);
      if (!bVar1) {
        this = (UserErrorException *)__cxa_allocate_exception(0x50);
        Lib::UserErrorException::Exception(this,"only reals and integers are allowed in smt2");
        __cxa_throw(this,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      RealConstantType::RealConstantType((RealConstantType *)&local_70,0);
      bVar1 = RationalConstantType::operator>(&local_70,&r.super_RationalConstantType);
      RationalConstantType::~RationalConstantType(&local_70);
      if (bVar1) {
        std::operator<<(out,"(-");
      }
      IntegerConstantType::IntegerConstantType(&local_70._num,1);
      l = &r.super_RationalConstantType._den;
      bVar1 = Kernel::operator!=(l,&local_70._num);
      IntegerConstantType::~IntegerConstantType(&local_70._num);
      if (bVar1) {
        IntegerConstantType::abs(&local_70._num,(int)&r);
        poVar2 = Kernel::operator<<(out,&local_70._num);
        std::operator<<(poVar2,".0");
      }
      else {
        poVar2 = std::operator<<(out,"(/ ");
        IntegerConstantType::abs(&local_70._num,(int)&r);
        poVar2 = Kernel::operator<<(poVar2,&local_70._num);
        poVar2 = std::operator<<(poVar2,".0 ");
        poVar2 = Kernel::operator<<(poVar2,l);
        std::operator<<(poVar2,".0)");
      }
      IntegerConstantType::~IntegerConstantType(&local_70._num);
      RealConstantType::RealConstantType((RealConstantType *)&local_70,0);
      bVar1 = RationalConstantType::operator>(&local_70,&r.super_RationalConstantType);
      RationalConstantType::~RationalConstantType(&local_70);
      if (bVar1) {
        std::operator<<(out,")");
      }
    }
    RationalConstantType::~RationalConstantType(&r.super_RationalConstantType);
    IntegerConstantType::~IntegerConstantType(&i);
    return;
  }
  if (DAT_00a14190->_foolConstantsDefined == true) {
    if (DAT_00a14190->_foolTrue == f) {
      pcVar3 = "true";
    }
    else {
      if (DAT_00a14190->_foolFalse != f) goto LAB_0042de8c;
      pcVar3 = "false";
    }
    std::operator<<(out,pcVar3);
    return;
  }
LAB_0042de8c:
  name = Signature::functionName_abi_cxx11_(DAT_00a14190,f);
  outputQuoted(out,name);
  return;
}

Assistant:

static void outputFunctionName(std::ostream& out, unsigned f) 
  {
    if (theory->isInterpretedFunction(f)) {
      outputInterpretationName(out, theory->interpretFunction(f));
    } else if (theory->isInterpretedConstant(f)) {
      IntegerConstantType i;
      RealConstantType r;
      if (theory->tryInterpretConstant(f, i)) {
        if (i < IntegerConstantType(0)) {
          out << "(- " << i.abs() << ")";
        } else {
          out << i;
        }

      } else if (theory->tryInterpretConstant(f, r)) {
        if (r < RealConstantType(0)) {
          out << "(-";
        }
        if (r.denominator() != IntegerConstantType(1)) {
          out << r.numerator().abs() << ".0";
        } else {
          out << "(/ " << r.numerator().abs() << ".0 " << r.denominator() << ".0)";
        }
        if (r < RealConstantType(0)) {
          out << ")";
        }

      } else {
        throw UserErrorException("only reals and integers are allowed in smt2");
      }

    } else if (env.signature->isFoolConstantSymbol(true, f)) {
      out << "true";

    } else if (env.signature->isFoolConstantSymbol(false, f)) {
      out << "false";

    } else {
      auto& name = env.signature->functionName(f);
      outputQuoted(out, name);
    }
  }